

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

bool __thiscall
bssl::ssl_select_ech_config
          (bssl *this,SSL_HANDSHAKE *hs,Span<unsigned_char> out_enc,size_t *out_enc_len)

{
  ushort uVar1;
  bssl *pbVar2;
  uchar *puVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  pointer __p;
  size_t sVar8;
  EVP_HPKE_KEM *kem;
  EVP_HPKE_AEAD *pEVar9;
  EVP_HPKE_KDF *kdf;
  size_t info_len;
  ECHConfig *__p_00;
  undefined8 extraout_RAX;
  uint8_t *puVar10;
  EVP_HPKE_AEAD *aead;
  bool supported;
  uint16_t local_112;
  uint8_t *local_110;
  uint16_t kdf_id;
  bssl *local_100;
  SSLTranscript *local_f8;
  EVP_HPKE_CTX *local_f0;
  SSL_HANDSHAKE *local_e8;
  uchar *local_e0;
  size_t *local_d8;
  bssl *local_d0;
  CBS child;
  ECHConfig ech_config;
  CBS cbs;
  CBS cbs_1;
  
  *(size_t *)out_enc.size_ = 0;
  bVar4 = 1;
  if (0x303 < *(ushort *)(this + 0x1e)) {
    cbs.len = *(size_t *)(*(long *)(this + 8) + 0x100);
    if (cbs.len != 0) {
      puVar10 = *(uint8_t **)(*(long *)(this + 8) + 0xf8);
      cbs.data = puVar10;
      iVar6 = CBS_get_u16_length_prefixed(&cbs,&child);
      if (iVar6 == 0) {
        bVar4 = 0;
      }
      else {
        bVar4 = 0;
        if ((child.len != 0) && (cbs.len == 0)) {
          local_f0 = (EVP_HPKE_CTX *)(this + 0x350);
          local_f8 = (SSLTranscript *)(this + 0x238);
          local_100 = this + 0x6a0;
          local_110 = (uint8_t *)CONCAT44(local_110._4_4_,(int)puVar10);
          sVar8 = 1;
          local_e8 = hs;
          local_e0 = out_enc.data_;
          local_d8 = (size_t *)out_enc.size_;
          local_d0 = this;
          do {
            if (sVar8 == 0) {
              bVar4 = 1;
              goto LAB_001330e3;
            }
            ech_config.cipher_suites.data_ = (uchar *)0x0;
            ech_config.cipher_suites.size_ = 0;
            ech_config.public_name.data_ = (uchar *)0x0;
            ech_config.public_name.size_ = 0;
            ech_config.public_key.data_ = (uchar *)0x0;
            ech_config.public_key.size_ = 0;
            ech_config.raw.data_ = (uchar *)0x0;
            ech_config.raw.size_ = 0;
            ech_config.kem_id = 0;
            ech_config.maximum_name_length = '\0';
            ech_config.config_id = '\0';
            bVar5 = parse_ech_config(&child,&ech_config,&supported,false);
            if (bVar5) {
              kem = EVP_hpke_x25519_hkdf_sha256();
              sVar8 = ech_config.cipher_suites.size_;
              puVar3 = ech_config.cipher_suites.data_;
              bVar5 = true;
              if ((supported == true) && (ech_config.kem_id == 0x20)) {
                uVar1 = *(ushort *)(*(long *)(*(long *)local_d0 + 8) + 0x10d);
                if ((uVar1 >> 0xb & 1) == 0) {
                  uVar7 = EVP_has_aes_hardware();
                }
                else {
                  uVar7 = uVar1 >> 0xc & 1;
                }
                cbs_1.data = puVar3;
                cbs_1.len = sVar8;
                aead = (EVP_HPKE_AEAD *)0x0;
                while (cbs_1.len != 0) {
                  iVar6 = CBS_get_u16(&cbs_1,&kdf_id);
                  if ((iVar6 == 0) || (iVar6 = CBS_get_u16(&cbs_1,&local_112), iVar6 == 0))
                  goto LAB_00132f2e;
                  pEVar9 = get_ech_aead(local_112);
                  if (((pEVar9 != (EVP_HPKE_AEAD *)0x0) && (kdf_id == 1)) &&
                     ((aead == (EVP_HPKE_AEAD *)0x0 || ((uVar7 == 0 && (local_112 == 3)))))) {
                    aead = pEVar9;
                  }
                }
                if (aead != (EVP_HPKE_AEAD *)0x0) {
                  kdf = EVP_hpke_hkdf_sha256();
                  CBB_zero((CBB *)&cbs_1);
                  iVar6 = CBB_init((CBB *)&cbs_1,ech_config.raw.size_ + 8);
                  if (((iVar6 == 0) ||
                      (iVar6 = CBB_add_bytes((CBB *)&cbs_1,"tls ech",8), iVar6 == 0)) ||
                     (iVar6 = CBB_add_bytes((CBB *)&cbs_1,ech_config.raw.data_,ech_config.raw.size_)
                     , sVar8 = ech_config.public_key.size_, puVar3 = ech_config.public_key.data_,
                     iVar6 == 0)) {
LAB_001330bf:
                    local_110 = (uint8_t *)((ulong)local_110 & 0xffffffff00000000);
                  }
                  else {
                    local_110 = CBB_data((CBB *)&cbs_1);
                    info_len = CBB_len((CBB *)&cbs_1);
                    iVar6 = EVP_HPKE_CTX_setup_sender
                                      (local_f0,(uint8_t *)local_e8,local_d8,(size_t)local_e0,kem,
                                       kdf,aead,puVar3,sVar8,local_110,info_len);
                    if ((iVar6 == 0) || (bVar5 = SSLTranscript::Init(local_f8), !bVar5))
                    goto LAB_001330bf;
                    __p_00 = New<bssl::ECHConfig,bssl::ECHConfig>(&ech_config);
                    pbVar2 = local_100;
                    _kdf_id = (ECHConfig *)0x0;
                    std::__uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter> *)
                               local_100,__p_00);
                    std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter> *)&kdf_id);
                    local_110 = (uint8_t *)
                                CONCAT44(local_110._4_4_,
                                         (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),
                                                       *(long *)pbVar2 != 0));
                  }
                  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&cbs_1);
                  bVar5 = false;
                }
              }
            }
            else {
              bVar5 = false;
              local_110 = (uint8_t *)((ulong)local_110 & 0xffffffff00000000);
            }
LAB_00132f2e:
            Array<unsigned_char>::~Array(&ech_config.raw);
            sVar8 = child.len;
          } while (bVar5);
          bVar4 = (byte)local_110;
        }
      }
    }
  }
LAB_001330e3:
  return (bool)(bVar4 & 1);
}

Assistant:

bool ssl_select_ech_config(SSL_HANDSHAKE *hs, Span<uint8_t> out_enc,
                           size_t *out_enc_len) {
  *out_enc_len = 0;
  if (hs->max_version < TLS1_3_VERSION) {
    // ECH requires TLS 1.3.
    return true;
  }

  if (!hs->config->client_ech_config_list.empty()) {
    CBS cbs = CBS(hs->config->client_ech_config_list);
    CBS child;
    if (!CBS_get_u16_length_prefixed(&cbs, &child) ||  //
        CBS_len(&child) == 0 ||                        //
        CBS_len(&cbs) > 0) {
      return false;
    }
    // Look for the first ECHConfig with supported parameters.
    while (CBS_len(&child) > 0) {
      ECHConfig ech_config;
      bool supported;
      if (!parse_ech_config(&child, &ech_config, &supported,
                            /*all_extensions_mandatory=*/false)) {
        return false;
      }
      const EVP_HPKE_KEM *kem = EVP_hpke_x25519_hkdf_sha256();
      const EVP_HPKE_KDF *kdf;
      const EVP_HPKE_AEAD *aead;
      if (supported &&  //
          ech_config.kem_id == EVP_HPKE_DHKEM_X25519_HKDF_SHA256 &&
          select_ech_cipher_suite(&kdf, &aead, ech_config.cipher_suites,
                                  hs->ssl->config->aes_hw_override
                                      ? hs->ssl->config->aes_hw_override_value
                                      : EVP_has_aes_hardware())) {
        ScopedCBB info;
        static const uint8_t kInfoLabel[] = "tls ech";  // includes trailing NUL
        if (!CBB_init(info.get(), sizeof(kInfoLabel) + ech_config.raw.size()) ||
            !CBB_add_bytes(info.get(), kInfoLabel, sizeof(kInfoLabel)) ||
            !CBB_add_bytes(info.get(), ech_config.raw.data(),
                           ech_config.raw.size())) {
          return false;
        }

        if (!EVP_HPKE_CTX_setup_sender(
                hs->ech_hpke_ctx.get(), out_enc.data(), out_enc_len,
                out_enc.size(), kem, kdf, aead, ech_config.public_key.data(),
                ech_config.public_key.size(), CBB_data(info.get()),
                CBB_len(info.get())) ||
            !hs->inner_transcript.Init()) {
          return false;
        }

        hs->selected_ech_config = MakeUnique<ECHConfig>(std::move(ech_config));
        return hs->selected_ech_config != nullptr;
      }
    }
  }

  return true;
}